

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O2

void test_divceil<std::vector<unsigned_long,std::allocator<unsigned_long>>,long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *values,long divisor,
               size_t attempt_count)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  bool bVar4;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  while (bVar4 = attempt_count != 0, attempt_count = attempt_count - 1, bVar4) {
    std::
    accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,test_divceil<std::vector<unsigned_long,std::allocator<unsigned_long>>,long>(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,long,unsigned_long)::_lambda(auto:1,auto:2)_1_>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish,0,(anon_class_8_1_e7267f7e)divisor);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_1fcde);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}